

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O3

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  lVar3 = SUNBandMatrix_Columns();
  if (lVar3 < 1) {
    uVar2 = 0;
  }
  else {
    iVar8 = 0;
    uVar9 = 0;
    do {
      lVar3 = SUNBandMatrix_Column(A,uVar9);
      lVar4 = SUNBandMatrix_UpperBandwidth(A);
      uVar5 = uVar9;
      if (lVar4 <= (long)uVar9) {
        uVar5 = SUNBandMatrix_UpperBandwidth(A);
      }
      lVar4 = SUNBandMatrix_Columns(A);
      uVar6 = SUNBandMatrix_LowerBandwidth(A);
      if ((long)(~uVar6 + lVar4) < (long)uVar9) {
        lVar4 = SUNBandMatrix_Columns();
        lVar4 = ~uVar9 + lVar4;
      }
      else {
        lVar4 = SUNBandMatrix_LowerBandwidth(A);
      }
      lVar7 = -uVar5;
      if (SBORROW8(lVar4,lVar7) == (long)(lVar4 + uVar5) < 0) {
        do {
          iVar1 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar7 * 8),val,tol);
          if (iVar1 != 0) {
            iVar8 = iVar8 + 1;
            printf("j = %li, Acolj[%li] = %g, val = %g\n",*(undefined8 *)(lVar3 + lVar7 * 8),val,
                   uVar9,lVar7);
          }
          lVar7 = lVar7 + 1;
        } while (lVar4 + 1 != lVar7);
      }
      uVar9 = uVar9 + 1;
      lVar3 = SUNBandMatrix_Columns(A);
    } while ((long)uVar9 < lVar3);
    uVar2 = (uint)(0 < iVar8);
  }
  return uVar2;
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  sunrealtype* Acolj;

  /* check matrix data */
  for (j = 0; j < SUNBandMatrix_Columns(A); j++)
  {
    /* access matrix column */
    Acolj = SUNBandMatrix_Column(A, j);

    /* compare entries in this column */
    istart = (j < SUNBandMatrix_UpperBandwidth(A))
               ? -j
               : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j > SUNBandMatrix_Columns(A) - 1 - SUNBandMatrix_LowerBandwidth(A))
             ? SUNBandMatrix_Columns(A) - 1 - j
             : SUNBandMatrix_LowerBandwidth(A);
    for (i = istart; i <= iend; i++)
    {
      if (SUNRCompareTol(Acolj[i], val, tol))
      {
        failure++;
        printf("j = %li, Acolj[%li] = %" GSYM ", val = %" GSYM "\n",
               (long int)j, (long int)i, Acolj[i], val);
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}